

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O3

void __thiscall ByteCodeGenerator::CheckDeferParseHasMaybeEscapedNestedFunc(ByteCodeGenerator *this)

{
  ParseableFunctionInfo *this_00;
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  int iVar3;
  ByteCodeGenerator *this_01;
  SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *pSVar4;
  Type *ppFVar5;
  undefined4 *puVar6;
  FuncInfo *pFVar7;
  FunctionBody *pFVar8;
  FunctionBody *pFVar9;
  FunctionInfo *pFVar10;
  undefined4 extraout_var;
  char16 *pcVar11;
  undefined8 extraout_RAX;
  int extraout_EDX;
  Scope *this_02;
  ULONG_PTR unaff_R15;
  wchar local_a8 [4];
  char16 debugStringBuffer [42];
  Iterator local_40;
  
  if (this->parentScopeInfo != (ScopeInfo *)0x0) {
    pSVar4 = this->funcInfoStack;
    if ((pSVar4 == (SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)0x0) ||
       ((SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)
        (pSVar4->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).
        super_SListNodeBase<Memory::ArenaAllocator>.next == pSVar4)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      this_01 = (ByteCodeGenerator *)__tls_get_addr(&PTR_01548f08);
      *(undefined4 *)&this_01->scriptContext = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x82f,"(this->funcInfoStack && !this->funcInfoStack->Empty())",
                         "this->funcInfoStack && !this->funcInfoStack->Empty()");
      if (!bVar2) goto LAB_00826936;
      *(undefined4 *)&this_01->scriptContext = 0;
      pSVar4 = this->funcInfoStack;
      if (pSVar4 == (SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        local_40.list = &pSVar4->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>;
        local_40.current = (NodeBase *)pSVar4;
        CheckDeferParseHasMaybeEscapedNestedFunc(this_01);
        if (extraout_EDX == 1) {
          __cxa_begin_catch(extraout_RAX);
          FailedToBox_OOM_unrecoverable_error(unaff_R15);
          __cxa_end_catch();
          return;
        }
        _Unwind_Resume(extraout_RAX);
      }
    }
    local_40.current =
         (pSVar4->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).
         super_SListNodeBase<Memory::ArenaAllocator>.next;
    local_40.list = &pSVar4->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>;
    if ((SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current == pSVar4) {
      local_40.current = (NodeBase *)0x0;
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x834,"(succeed)","succeed");
      if (!bVar2) goto LAB_00826936;
      *puVar6 = 0;
    }
    ppFVar5 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(&local_40);
    bVar2 = FuncInfo::IsGlobalFunction(*ppFVar5);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x835,"(i.Data()->IsGlobalFunction())","i.Data()->IsGlobalFunction()");
      if (!bVar2) goto LAB_00826936;
      *puVar6 = 0;
    }
    ppFVar5 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(&local_40);
    if ((*ppFVar5)->root == (ParseNodeFnc *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x836,"(!i.Data()->IsRestored())","!i.Data()->IsRestored()");
      if (!bVar2) goto LAB_00826936;
      *puVar6 = 0;
    }
    if ((SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current ==
        (SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar2) goto LAB_00826936;
      *puVar6 = 0;
    }
    pSVar4 = (SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)
             (((SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current)->
             super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).
             super_SListNodeBase<Memory::ArenaAllocator>.next;
    local_40.current = (NodeBase *)(SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
    if (pSVar4 != (SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)local_40.list) {
      local_40.current = (NodeBase *)pSVar4;
    }
    ppFVar5 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(&local_40);
    pFVar7 = *ppFVar5;
    bVar2 = FuncInfo::IsGlobalFunction(pFVar7);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x83a,"(!top->IsGlobalFunction())","!top->IsGlobalFunction()");
      if (!bVar2) goto LAB_00826936;
      *puVar6 = 0;
    }
    if (pFVar7->root != (ParseNodeFnc *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x83b,"(top->IsRestored())","top->IsRestored()");
      if (!bVar2) goto LAB_00826936;
      *puVar6 = 0;
    }
    pFVar9 = (FunctionBody *)this->pRootFunc;
    bVar2 = Js::FunctionProxy::IsFunctionBody((FunctionProxy *)pFVar9);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                         ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
      if (!bVar2) goto LAB_00826936;
      *puVar6 = 0;
    }
    if (((pFVar9->super_ParseableFunctionInfo).flags & Flags_StackNestedFunc) == Flags_None) {
      FuncInfo::SetHasMaybeEscapedNestedFunc(pFVar7,L"DeferredChild");
    }
    else {
      this_02 = pFVar7->paramScope;
      if ((this_02 == (Scope *)0x0) && (this_02 = pFVar7->bodyScope, this_02 == (Scope *)0x0)) {
        this_02 = pFVar7->funcExprScope;
      }
      pFVar7 = Scope::GetEnclosingFunc(this_02);
      bVar2 = FuncInfo::IsGlobalFunction(pFVar7);
      if (!bVar2) {
        pFVar8 = (FunctionBody *)pFVar7->byteCodeFunction;
        if (pFVar8 == pFVar9) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar6 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                             ,0x84a,"(parentFunc->byteCodeFunction != rootFuncBody)",
                             "parentFunc->byteCodeFunction != rootFuncBody");
          if (!bVar2) {
LAB_00826936:
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar6 = 0;
          pFVar8 = (FunctionBody *)pFVar7->byteCodeFunction;
        }
        if (((pFVar8->super_ParseableFunctionInfo).flags & Flags_StackNestedFunc) != Flags_None) {
          Js::FunctionBody::SetStackNestedFuncParent
                    (pFVar9,(pFVar8->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.
                            ptr);
        }
      }
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      ppFVar5 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(&local_40);
      pFVar7 = *ppFVar5;
      if (pFVar7->root != (ParseNodeFnc *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                           ,0x856,"(funcInfo->IsRestored())","funcInfo->IsRestored()");
        if (!bVar2) goto LAB_00826936;
        *puVar6 = 0;
      }
      this_00 = pFVar7->byteCodeFunction;
      if (this_00 == (ParseableFunctionInfo *)0x0) {
        if ((pFVar7->bodyScope != (Scope *)0x0) &&
           (pFVar7->bodyScope->scopeType == ScopeType_Global)) {
          return;
        }
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                           ,0x85a,
                           "(funcInfo->GetBodyScope() && funcInfo->GetBodyScope()->GetScopeType() == ScopeType_Global)"
                           ,
                           "funcInfo->GetBodyScope() && funcInfo->GetBodyScope()->GetScopeType() == ScopeType_Global"
                          );
        if (bVar2) {
          *puVar6 = 0;
          return;
        }
        goto LAB_00826936;
      }
      if ((this_00->flags & Flags_StackNestedFunc) == Flags_None) {
        return;
      }
      bVar2 = Js::FunctionProxy::IsFunctionBody(&this_00->super_FunctionProxy);
      if ((bVar2) &&
         (pFVar9 = FuncInfo::GetParsedFunctionBody(pFVar7), (pFVar7->field_0xb5 & 0x20) != 0)) {
        sourceContextId =
             Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->pCurrentFunction);
        pFVar8 = this->pCurrentFunction;
        pFVar10 = (pFVar8->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
        if (pFVar10 == (FunctionInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                             ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
          if (!bVar2) goto LAB_00826936;
          *puVar6 = 0;
          pFVar10 = (pFVar8->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
        }
        bVar2 = Js::Phases::IsEnabled
                          ((Phases *)&DAT_015bc490,StackFuncPhase,sourceContextId,
                           pFVar10->functionId);
        if (bVar2) {
          iVar3 = (*(pFVar9->super_ParseableFunctionInfo).super_FunctionProxy.
                    super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[7])(pFVar9);
          pcVar11 = Js::FunctionProxy::GetDebugNumberSet
                              ((FunctionProxy *)pFVar9,(wchar (*) [42])local_a8);
          Output::Print(L"DeferParse: box and disable stack function: %s (function %s)\n",
                        CONCAT44(extraout_var,iVar3),pcVar11);
          Output::Flush();
        }
        Js::StackScriptFunction::Box(pFVar9,this->functionRef);
        return;
      }
      if ((SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current ==
          (SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar2) goto LAB_00826936;
        *puVar6 = 0;
      }
      local_40.current =
           (((SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current)->
           super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).
           super_SListNodeBase<Memory::ArenaAllocator>.next;
    } while ((SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current !=
             local_40.list);
  }
  return;
}

Assistant:

void ByteCodeGenerator::CheckDeferParseHasMaybeEscapedNestedFunc()
{
    if (!this->parentScopeInfo)
    {
        return;
    }

    Assert(this->funcInfoStack && !this->funcInfoStack->Empty());

    // Box the stack nested function if we detected new may be escaped use function.
    SList<FuncInfo *>::Iterator i(this->funcInfoStack);
    bool succeed = i.Next();
    Assert(succeed);
    Assert(i.Data()->IsGlobalFunction()); // We always leave a glo on type when defer parsing.
    Assert(!i.Data()->IsRestored());
    succeed = i.Next();
    FuncInfo * top = i.Data();

    Assert(!top->IsGlobalFunction());
    Assert(top->IsRestored());
    Js::FunctionBody * rootFuncBody = this->GetRootFunc()->GetFunctionBody();
    if (!rootFuncBody->DoStackNestedFunc())
    {
        top->SetHasMaybeEscapedNestedFunc(DebugOnly(_u("DeferredChild")));
    }
    else
    {
        // We have to wait until it is parsed before we populate the stack nested func parent.
        Scope * enclosingScope = top->GetParamScope() ? top->GetParamScope() :
                                 top->GetBodyScope() ? top->GetBodyScope() :
                                 top->GetFuncExprScope();
        FuncInfo * parentFunc = enclosingScope->GetEnclosingFunc();
        if (!parentFunc->IsGlobalFunction())
        {
            Assert(parentFunc->byteCodeFunction != rootFuncBody);
            Js::ParseableFunctionInfo * parentFunctionInfo = parentFunc->byteCodeFunction;
            if (parentFunctionInfo->DoStackNestedFunc())
            {
                rootFuncBody->SetStackNestedFuncParent(parentFunctionInfo->GetFunctionInfo());
            }
        }
    }

    do
    {
        FuncInfo * funcInfo = i.Data();
        Assert(funcInfo->IsRestored());
        Js::ParseableFunctionInfo * parseableFunctionInfo = funcInfo->byteCodeFunction;
        if (parseableFunctionInfo == nullptr)
        {
            Assert(funcInfo->GetBodyScope() && funcInfo->GetBodyScope()->GetScopeType() == ScopeType_Global);
            return;
        }
        bool didStackNestedFunc = parseableFunctionInfo->DoStackNestedFunc();
        if (!didStackNestedFunc)
        {
            return;
        }
        if (!parseableFunctionInfo->IsFunctionBody())
        {
            continue;
        }
        Js::FunctionBody * functionBody = funcInfo->GetParsedFunctionBody();
        if (funcInfo->HasMaybeEscapedNestedFunc())
        {
            // This should box the rest of the parent functions.
            if (PHASE_TESTTRACE(Js::StackFuncPhase, this->pCurrentFunction))
            {
                char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];

                Output::Print(_u("DeferParse: box and disable stack function: %s (function %s)\n"),
                    functionBody->GetDisplayName(), functionBody->GetDebugNumberSet(debugStringBuffer));
                Output::Flush();
            }

            // During the box workflow we reset all the parents of all nested functions and up. If a fault occurs when the stack function
            // is created this will cause further issues when trying to use the function object again. So failing faster seems to make more sense.
            try
            {
                Js::StackScriptFunction::Box(functionBody, functionRef);
            }
            catch (Js::OutOfMemoryException)
            {
                FailedToBox_OOM_unrecoverable_error((ULONG_PTR)functionBody);
            }

            return;
        }
    }
    while (i.Next());
}